

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O3

void __thiscall
QPDF::getAllPagesInternal
          (QPDF *this,QPDFObjectHandle *cur_node,set *visited,set *seen,bool media_box)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint uVar2;
  char cVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  QPDFObjGen QVar9;
  iterator key;
  long *plVar10;
  QPDFExc *pQVar11;
  string *psVar12;
  ulong uVar13;
  size_type *psVar14;
  uint uVar15;
  uint uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  string __str;
  QPDFObjectHandle kids;
  bool local_119;
  string local_118;
  undefined1 local_f8 [32];
  string local_d8;
  string *local_b8;
  QPDFObjectHandle *local_b0;
  set *local_a8;
  uint local_9c;
  set *local_98;
  BaseHandle local_90;
  Array local_80;
  pointer local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  QPDFObjectHandle local_58;
  QPDFObjectHandle *local_48;
  QPDFObjectHandle local_40;
  
  local_b8 = (string *)cur_node;
  local_b0 = (QPDFObjectHandle *)this;
  local_a8 = seen;
  QVar9 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&cur_node->super_BaseHandle);
  local_98 = visited;
  bVar7 = QPDFObjGen::set::add(visited,QVar9);
  if (!bVar7) {
    pQVar11 = (QPDFExc *)__cxa_allocate_exception(0x80);
    psVar12 = (string *)
              (**(code **)(**(long **)&(((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                            *)&(local_b0->super_BaseHandle).obj.
                                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->
                                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                         ).super__Head_base<0UL,_QPDF::Members_*,_false>.
                                        _M_head_impl)->file).
                                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                          0x18))();
    local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_b8);
    QPDFObjGen::unparse_abi_cxx11_((string *)local_f8,(QPDFObjGen *)&local_80,' ');
    std::operator+(&local_118,"object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Loop detected in /Pages structure (getAllPages)","");
    QPDFExc::QPDFExc(pQVar11,qpdf_e_pages,psVar12,&local_118,0,&local_d8);
    __cxa_throw(pQVar11,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  paVar17 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/Pages","");
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"");
  bVar7 = QPDFObjectHandle::isDictionaryOfType
                    ((QPDFObjectHandle *)local_b8,&local_118,(string *)local_f8);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar17) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    local_118._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"/Type key should be /Pages but is not; overriding","");
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_b8,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar17) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    local_118._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/Type","");
    operator____qpdf(local_f8,0x26b284);
    QPDFObjectHandle::replaceKey
              ((QPDFObjectHandle *)local_b8,&local_118,(QPDFObjectHandle *)local_f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar17) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  local_119 = true;
  if (!media_box) {
    local_118._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/MediaBox","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_f8,local_b8);
    local_119 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)local_f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar17) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  local_118._M_dataplus._M_p = (pointer)paVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/Kids","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_90,local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar17) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  QVar9 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&local_90);
  bVar7 = QPDFObjGen::set::add(local_98,QVar9);
  if (!bVar7) {
    pQVar11 = (QPDFExc *)__cxa_allocate_exception(0x80);
    psVar12 = (string *)
              (**(code **)(**(long **)&(((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                            *)&(local_b0->super_BaseHandle).obj.
                                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->
                                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                         ).super__Head_base<0UL,_QPDF::Members_*,_false>.
                                        _M_head_impl)->file).
                                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                          0x18))();
    local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_b8);
    QPDFObjGen::unparse_abi_cxx11_((string *)local_f8,(QPDFObjGen *)&local_80,' ');
    std::operator+(&local_118,"object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Loop detected in /Pages structure (getAllPages)","");
    QPDFExc::QPDFExc(pQVar11,qpdf_e_pages,psVar12,&local_118,0,&local_d8);
    __cxa_throw(pQVar11,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_90.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_90.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_90.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_90.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_90.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_80.sp_elements._M_t.
  super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  .super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                    )0x0;
  key = ::qpdf::Array::begin(&local_80);
  local_48 = (QPDFObjectHandle *)::qpdf::Array::end(&local_80);
  if (key._M_current != local_48) {
    uVar16 = 0xffffffff;
    local_9c = (uint)local_119;
    do {
      paVar17 = &local_118.field_2;
      bVar7 = QPDFObjectHandle::isDictionary(key._M_current);
      uVar16 = uVar16 + 1;
      local_118._M_dataplus._M_p = (pointer)paVar17;
      if (bVar7) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/Kids","");
        bVar7 = QPDFObjectHandle::hasKey(key._M_current,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar17) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if (bVar7) {
          local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)(((string *)key._M_current)->_M_dataplus)._M_p;
          local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((string *)key._M_current)->_M_string_length;
          if (local_58.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_58.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_58.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_58.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_58.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          getAllPagesInternal((QPDF *)local_b0,&local_58,local_98,local_a8,SUB41(local_9c,0));
          if (local_58.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_58.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        else {
          cVar3 = (char)((int)uVar16 >> 0x1f);
          if (local_119 == false) {
            local_118._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/MediaBox","");
            QPDFObjectHandle::getKey((QPDFObjectHandle *)local_f8,(string *)key._M_current);
            bVar7 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)local_f8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar17) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            if (!bVar7) {
              uVar2 = -uVar16;
              if (0 < (int)uVar16) {
                uVar2 = uVar16;
              }
              uVar15 = 1;
              if (9 < uVar2) {
                uVar13 = (ulong)uVar2;
                uVar6 = 4;
                do {
                  uVar15 = uVar6;
                  uVar8 = (uint)uVar13;
                  if (uVar8 < 100) {
                    uVar15 = uVar15 - 2;
                    goto LAB_0023d983;
                  }
                  if (uVar8 < 1000) {
                    uVar15 = uVar15 - 1;
                    goto LAB_0023d983;
                  }
                  if (uVar8 < 10000) goto LAB_0023d983;
                  uVar13 = uVar13 / 10000;
                  uVar6 = uVar15 + 4;
                } while (99999 < uVar8);
                uVar15 = uVar15 + 1;
              }
LAB_0023d983:
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar15 - cVar3);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_d8._M_dataplus._M_p + (uVar16 >> 0x1f),uVar15,uVar2);
              plVar10 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_d8,0,(char *)0x0,0x283707);
              psVar14 = (size_type *)(plVar10 + 2);
              paVar17 = &local_118.field_2;
              if ((size_type *)*plVar10 == psVar14) {
                local_f8._16_8_ = *psVar14;
                local_f8._24_8_ = plVar10[3];
                local_f8._0_8_ = local_f8 + 0x10;
              }
              else {
                local_f8._16_8_ = *psVar14;
                local_f8._0_8_ = (size_type *)*plVar10;
              }
              local_f8._8_8_ = plVar10[1];
              *plVar10 = (long)psVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append(local_f8);
              psVar14 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_118.field_2._M_allocated_capacity = *psVar14;
                local_118.field_2._8_8_ = plVar10[3];
                local_118._M_dataplus._M_p = (pointer)paVar17;
              }
              else {
                local_118.field_2._M_allocated_capacity = *psVar14;
                local_118._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_118._M_string_length = plVar10[1];
              *plVar10 = (long)psVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              QPDFObjectHandle::warnIfPossible(key._M_current,&local_118);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != paVar17) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
                operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              local_118._M_dataplus._M_p = (pointer)paVar17;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/MediaBox","");
              local_f8._0_8_ = (pointer)0x0;
              local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_f8._16_8_ = 0x4083200000000000;
              local_f8._24_8_ = 0x4088c00000000000;
              QPDFObjectHandle::newArray((QPDFObjectHandle *)&local_d8,(Rectangle *)local_f8);
              QPDFObjectHandle::replaceKey(key._M_current,&local_118,(QPDFObjectHandle *)&local_d8);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length
                          );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != paVar17) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
            }
          }
          bVar7 = QPDFObjectHandle::isIndirect(key._M_current);
          if (bVar7) {
            QVar9 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                              (&(key._M_current)->super_BaseHandle);
            bVar7 = QPDFObjGen::set::add(local_a8,QVar9);
            if (!bVar7) {
              uVar2 = -uVar16;
              if (0 < (int)uVar16) {
                uVar2 = uVar16;
              }
              uVar15 = 1;
              if (9 < uVar2) {
                uVar13 = (ulong)uVar2;
                uVar6 = 4;
                do {
                  uVar15 = uVar6;
                  uVar8 = (uint)uVar13;
                  if (uVar8 < 100) {
                    uVar15 = uVar15 - 2;
                    goto LAB_0023de12;
                  }
                  if (uVar8 < 1000) {
                    uVar15 = uVar15 - 1;
                    goto LAB_0023de12;
                  }
                  if (uVar8 < 10000) goto LAB_0023de12;
                  uVar13 = uVar13 / 10000;
                  uVar6 = uVar15 + 4;
                } while (99999 < uVar8);
                uVar15 = uVar15 + 1;
              }
LAB_0023de12:
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar15 - cVar3);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_d8._M_dataplus._M_p + (uVar16 >> 0x1f),uVar15,uVar2);
              plVar10 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_d8,0,(char *)0x0,0x283707);
              psVar14 = (size_type *)(plVar10 + 2);
              if ((size_type *)*plVar10 == psVar14) {
                local_f8._16_8_ = *psVar14;
                local_f8._24_8_ = plVar10[3];
                local_f8._0_8_ = local_f8 + 0x10;
              }
              else {
                local_f8._16_8_ = *psVar14;
                local_f8._0_8_ = (size_type *)*plVar10;
              }
              local_f8._8_8_ = plVar10[1];
              *plVar10 = (long)psVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append(local_f8);
              psVar14 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_118.field_2._M_allocated_capacity = *psVar14;
                local_118.field_2._8_8_ = plVar10[3];
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              }
              else {
                local_118.field_2._M_allocated_capacity = *psVar14;
                local_118._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_118._M_string_length = plVar10[1];
              *plVar10 = (long)psVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_b8,&local_118);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
                operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              local_f8._0_8_ = (((string *)key._M_current)->_M_dataplus)._M_p;
              local_f8._8_8_ = ((string *)key._M_current)->_M_string_length;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->
                       _M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->
                       _M_use_count + 1;
                }
              }
              QPDFObjectHandle::shallowCopy(&local_40);
              makeIndirectObject((QPDF *)&local_118,local_b0);
              sVar5 = local_118._M_string_length;
              _Var4._M_p = local_118._M_dataplus._M_p;
              local_118._M_dataplus._M_p = (pointer)0x0;
              local_118._M_string_length = 0;
              p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((string *)key._M_current)->_M_string_length;
              (((string *)key._M_current)->_M_dataplus)._M_p = _Var4._M_p;
              ((string *)key._M_current)->_M_string_length = sVar5;
              if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_118._M_string_length);
              }
              if (local_40.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_40.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
              }
              QVar9 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                                (&(key._M_current)->super_BaseHandle);
              QPDFObjGen::set::add(local_a8,QVar9);
            }
          }
          else {
            uVar2 = -uVar16;
            if (0 < (int)uVar16) {
              uVar2 = uVar16;
            }
            uVar15 = 1;
            if (9 < uVar2) {
              uVar13 = (ulong)uVar2;
              uVar6 = 4;
              do {
                uVar15 = uVar6;
                uVar8 = (uint)uVar13;
                if (uVar8 < 100) {
                  uVar15 = uVar15 - 2;
                  goto LAB_0023dc2d;
                }
                if (uVar8 < 1000) {
                  uVar15 = uVar15 - 1;
                  goto LAB_0023dc2d;
                }
                if (uVar8 < 10000) goto LAB_0023dc2d;
                uVar13 = uVar13 / 10000;
                uVar6 = uVar15 + 4;
              } while (99999 < uVar8);
              uVar15 = uVar15 + 1;
            }
LAB_0023dc2d:
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar15 - cVar3);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_d8._M_dataplus._M_p + (uVar16 >> 0x1f),uVar15,uVar2);
            plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x283707)
            ;
            psVar14 = (size_type *)(plVar10 + 2);
            if ((size_type *)*plVar10 == psVar14) {
              local_f8._16_8_ = *psVar14;
              local_f8._24_8_ = plVar10[3];
              local_f8._0_8_ = local_f8 + 0x10;
            }
            else {
              local_f8._16_8_ = *psVar14;
              local_f8._0_8_ = (size_type *)*plVar10;
            }
            local_f8._8_8_ = plVar10[1];
            *plVar10 = (long)psVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append(local_f8);
            psVar14 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_118.field_2._M_allocated_capacity = *psVar14;
              local_118.field_2._8_8_ = plVar10[3];
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            }
            else {
              local_118.field_2._M_allocated_capacity = *psVar14;
              local_118._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_118._M_string_length = plVar10[1];
            *plVar10 = (long)psVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_b8,&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
              operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            local_68 = (((string *)key._M_current)->_M_dataplus)._M_p;
            local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((string *)key._M_current)->_M_string_length;
            if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_60->_M_use_count = local_60->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_60->_M_use_count = local_60->_M_use_count + 1;
              }
            }
            makeIndirectObject((QPDF *)&local_118,local_b0);
            sVar5 = local_118._M_string_length;
            _Var4._M_p = local_118._M_dataplus._M_p;
            local_118._M_dataplus._M_p = (pointer)0x0;
            local_118._M_string_length = 0;
            p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((string *)key._M_current)->_M_string_length;
            (((string *)key._M_current)->_M_dataplus)._M_p = _Var4._M_p;
            ((string *)key._M_current)->_M_string_length = sVar5;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length)
              ;
            }
            if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
            }
          }
          paVar17 = &local_118.field_2;
          local_118._M_dataplus._M_p = (pointer)paVar17;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/Page","");
          local_f8._0_8_ = local_f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"");
          bVar7 = QPDFObjectHandle::isDictionaryOfType(key._M_current,&local_118,(string *)local_f8)
          ;
          if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != paVar17) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if (!bVar7) {
            local_118._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,"/Type key should be /Page but is not; overriding","");
            QPDFObjectHandle::warnIfPossible(key._M_current,&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar17) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            local_118._M_dataplus._M_p = (pointer)paVar17;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/Type","");
            operator____qpdf((char *)local_f8,0x27d09a);
            QPDFObjectHandle::replaceKey(key._M_current,&local_118,(QPDFObjectHandle *)local_f8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar17) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    (&((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_> *)
                        &(local_b0->super_BaseHandle).obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>)
                       .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->all_pages,
                     key._M_current);
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"Pages tree includes non-dictionary object; ignoring","");
        QPDFObjectHandle::warnIfPossible(key._M_current,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar17) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        ((((tuple<QPDF::Members_*,_std::default_delete<QPDF::Members>_> *)
          &(local_b0->super_BaseHandle).obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>).
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->invalid_page_found = true;
      }
      key._M_current = (QPDFObjectHandle *)&((string *)key._M_current)->field_2;
    } while (key._M_current != local_48);
  }
  std::
  unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ::~unique_ptr(&local_80.sp_elements);
  if (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_90.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void
QPDF::getAllPagesInternal(
    QPDFObjectHandle cur_node, QPDFObjGen::set& visited, QPDFObjGen::set& seen, bool media_box)
{
    if (!visited.add(cur_node)) {
        throw QPDFExc(
            qpdf_e_pages,
            m->file->getName(),
            "object " + cur_node.getObjGen().unparse(' '),
            0,
            "Loop detected in /Pages structure (getAllPages)");
    }
    if (!cur_node.isDictionaryOfType("/Pages")) {
        cur_node.warnIfPossible("/Type key should be /Pages but is not; overriding");
        cur_node.replaceKey("/Type", "/Pages"_qpdf);
    }
    if (!media_box) {
        media_box = cur_node.getKey("/MediaBox").isRectangle();
        QTC::TC("qpdf", "QPDF inherit mediabox", media_box ? 0 : 1);
    }
    auto kids = cur_node.getKey("/Kids");
    if (!visited.add(kids)) {
        throw QPDFExc(
            qpdf_e_pages,
            m->file->getName(),
            "object " + cur_node.getObjGen().unparse(' '),
            0,
            "Loop detected in /Pages structure (getAllPages)");
    }
    int i = -1;
    for (auto& kid: kids.as_array()) {
        ++i;
        if (!kid.isDictionary()) {
            kid.warnIfPossible("Pages tree includes non-dictionary object; ignoring");
            m->invalid_page_found = true;
            continue;
        }
        if (kid.hasKey("/Kids")) {
            getAllPagesInternal(kid, visited, seen, media_box);
        } else {
            if (!media_box && !kid.getKey("/MediaBox").isRectangle()) {
                QTC::TC("qpdf", "QPDF missing mediabox");
                kid.warnIfPossible(
                    "kid " + std::to_string(i) +
                    " (from 0) MediaBox is undefined; setting to letter / ANSI A");
                kid.replaceKey(
                    "/MediaBox",
                    QPDFObjectHandle::newArray(QPDFObjectHandle::Rectangle(0, 0, 612, 792)));
            }
            if (!kid.isIndirect()) {
                QTC::TC("qpdf", "QPDF handle direct page object");
                cur_node.warnIfPossible(
                    "kid " + std::to_string(i) + " (from 0) is direct; converting to indirect");
                kid = makeIndirectObject(kid);
            } else if (!seen.add(kid)) {
                // Make a copy of the page. This does the same as shallowCopyPage in
                // QPDFPageObjectHelper.
                QTC::TC("qpdf", "QPDF resolve duplicated page object");
                cur_node.warnIfPossible(
                    "kid " + std::to_string(i) +
                    " (from 0) appears more than once in the pages tree;"
                    " creating a new page object as a copy");
                kid = makeIndirectObject(QPDFObjectHandle(kid).shallowCopy());
                seen.add(kid);
            }
            if (!kid.isDictionaryOfType("/Page")) {
                kid.warnIfPossible("/Type key should be /Page but is not; overriding");
                kid.replaceKey("/Type", "/Page"_qpdf);
            }
            m->all_pages.push_back(kid);
        }
    }
}